

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O0

utf8proc_bool grapheme_break_extended(int lbc,int tbc,utf8proc_int32_t *state)

{
  utf8proc_bool uVar1;
  int local_1c;
  utf8proc_bool break_permitted;
  int lbc_override;
  utf8proc_int32_t *state_local;
  int tbc_local;
  int lbc_local;
  
  local_1c = lbc;
  if ((state != (utf8proc_int32_t *)0x0) && (*state != 0)) {
    local_1c = *state;
  }
  uVar1 = grapheme_break_simple(local_1c,tbc);
  if (state != (utf8proc_int32_t *)0x0) {
    if ((*state == tbc) && (tbc == 0xb)) {
      *state = 1;
    }
    else if (((*state == 0xf) || (*state == 0x12)) && (tbc == 5)) {
      *state = 0xf;
    }
    else {
      *state = tbc;
    }
  }
  return uVar1;
}

Assistant:

static utf8proc_bool grapheme_break_extended(int lbc, int tbc, utf8proc_int32_t *state)
{
  int lbc_override = lbc;
  if (state && *state != UTF8PROC_BOUNDCLASS_START)
    lbc_override = *state;
  utf8proc_bool break_permitted = grapheme_break_simple(lbc_override, tbc);
  if (state) {
    // Special support for GB 12/13 made possible by GB999. After two RI
    // class codepoints we want to force a break. Do this by resetting the
    // second RI's bound class to UTF8PROC_BOUNDCLASS_OTHER, to force a break
    // after that character according to GB999 (unless of course such a break is
    // forbidden by a different rule such as GB9).
    if (*state == tbc && tbc == UTF8PROC_BOUNDCLASS_REGIONAL_INDICATOR)
      *state = UTF8PROC_BOUNDCLASS_OTHER;
    // Special support for GB10. Fold any EXTEND codepoints into the previous
    // boundclass if we're dealing with an emoji base boundclass.
    else if ((*state == UTF8PROC_BOUNDCLASS_E_BASE      ||
              *state == UTF8PROC_BOUNDCLASS_E_BASE_GAZ) &&
             tbc == UTF8PROC_BOUNDCLASS_EXTEND)
      *state = UTF8PROC_BOUNDCLASS_E_BASE;
    else
      *state = tbc;
  }
  return break_permitted;
}